

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int doMount(PHYSFS_Io *io,char *fname,char *mountPoint,int appendToPath)

{
  int iVar1;
  DirHandle **ppDVar2;
  DirHandle *pDVar3;
  __PHYSFS_DIRHANDLE__ **pp_Var4;
  DirHandle *pDVar5;
  char *mountPoint_00;
  
  mountPoint_00 = "/";
  if (mountPoint != (char *)0x0) {
    mountPoint_00 = mountPoint;
  }
  __PHYSFS_platformGrabMutex(stateLock);
  ppDVar2 = &searchPath;
  pDVar5 = (DirHandle *)0x0;
  while (pDVar3 = *ppDVar2, pDVar3 != (DirHandle *)0x0) {
    if ((pDVar3->dirName != (char *)0x0) && (iVar1 = strcmp(fname,pDVar3->dirName), iVar1 == 0))
    goto LAB_00107c62;
    pDVar5 = pDVar3;
    ppDVar2 = &pDVar3->next;
  }
  iVar1 = 0;
  pDVar3 = createDirHandle(io,fname,mountPoint_00,0);
  if (pDVar3 != (DirHandle *)0x0) {
    if (appendToPath == 0) {
      pDVar3->next = searchPath;
      pp_Var4 = &searchPath;
    }
    else {
      pp_Var4 = &searchPath;
      if (pDVar5 != (DirHandle *)0x0) {
        pp_Var4 = &pDVar5->next;
      }
    }
    *pp_Var4 = pDVar3;
LAB_00107c62:
    iVar1 = 1;
  }
  __PHYSFS_platformReleaseMutex(stateLock);
  return iVar1;
}

Assistant:

static int doMount(PHYSFS_Io *io, const char *fname,
                   const char *mountPoint, int appendToPath)
{
    DirHandle *dh;
    DirHandle *prev = NULL;
    DirHandle *i;

    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    if (mountPoint == NULL)
        mountPoint = "/";

    __PHYSFS_platformGrabMutex(stateLock);

    for (i = searchPath; i != NULL; i = i->next)
    {
        /* already in search path? */
        if ((i->dirName != NULL) && (strcmp(fname, i->dirName) == 0))
            BAIL_MUTEX_ERRPASS(stateLock, 1);
        prev = i;
    } /* for */

    dh = createDirHandle(io, fname, mountPoint, 0);
    BAIL_IF_MUTEX_ERRPASS(!dh, stateLock, 0);

    if (appendToPath)
    {
        if (prev == NULL)
            searchPath = dh;
        else
            prev->next = dh;
    } /* if */
    else
    {
        dh->next = searchPath;
        searchPath = dh;
    } /* else */

    __PHYSFS_platformReleaseMutex(stateLock);
    return 1;
}